

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_zip.c
# Opt level: O0

wchar_t archive_read_format_zip_read_data(archive_read *a,void **buff,size_t *size,int64_t *offset)

{
  char cVar1;
  byte bVar2;
  void *pvVar3;
  char *pcVar4;
  undefined8 uVar5;
  zip *zip;
  wchar_t r;
  int64_t *offset_local;
  size_t *size_local;
  void **buff_local;
  archive_read *a_local;
  
  pvVar3 = a->format->data;
  if (*(int *)((long)pvVar3 + 0x38) == -1) {
    *(undefined4 *)((long)pvVar3 + 0x38) = 0;
  }
  *offset = *(int64_t *)((long)pvVar3 + 0x88);
  *size = 0;
  *buff = (void *)0x0;
  if (*(char *)((long)pvVar3 + 0xa2) == '\0') {
    if ((*(ushort *)(*(long *)((long)pvVar3 + 0x70) + 0x7c) & 0xf000) == 0x8000) {
      __archive_read_consume(a,*(int64_t *)((long)pvVar3 + 0x68));
      *(undefined8 *)((long)pvVar3 + 0x68) = 0;
      if (*(char *)((long)pvVar3 + 0x1f48) != '\0') {
        *(undefined4 *)((long)pvVar3 + 0x38) = 1;
        if ((*(ushort *)(*(long *)((long)pvVar3 + 0x70) + 0x7e) & 0x40) == 0) {
          if (*(char *)(*(long *)((long)pvVar3 + 0x70) + 0x80) == 'c') {
            zip._4_4_ = init_WinZip_AES_decryption(a);
          }
          else {
            zip._4_4_ = init_traditional_PKWARE_decryption(a);
          }
        }
        else {
          zip._4_4_ = read_decryption_header(a);
        }
        if (zip._4_4_ != L'\0') {
          return zip._4_4_;
        }
        *(undefined1 *)((long)pvVar3 + 0x1f48) = 0;
      }
      cVar1 = *(char *)(*(long *)((long)pvVar3 + 0x70) + 0x80);
      if (cVar1 == '\0') {
        zip._4_4_ = zip_read_data_none(a,buff,size,offset);
      }
      else if (cVar1 == '\b') {
        zip._4_4_ = zip_read_data_deflate(a,buff,size,offset);
      }
      else if (cVar1 == '\f') {
        zip._4_4_ = zip_read_data_zipx_bzip2(a,buff,size,offset);
      }
      else if (cVar1 == '\x0e') {
        zip._4_4_ = zip_read_data_zipx_lzma_alone(a,buff,size,offset);
      }
      else if (cVar1 == ']') {
        zip._4_4_ = zip_read_data_zipx_zstd(a,buff,size,offset);
      }
      else if (cVar1 == '_') {
        zip._4_4_ = zip_read_data_zipx_xz(a,buff,size,offset);
      }
      else {
        if (cVar1 != 'b') {
          bVar2 = *(byte *)(*(long *)((long)pvVar3 + 0x70) + 0x80);
          pcVar4 = compression_name((uint)*(byte *)(*(long *)((long)pvVar3 + 0x70) + 0x80));
          archive_set_error(&a->archive,0x54,"Unsupported ZIP compression method (%d: %s)",
                            (ulong)bVar2,pcVar4);
          return L'\xffffffe7';
        }
        zip._4_4_ = zip_read_data_zipx_ppmd(a,buff,size,offset);
      }
      if (zip._4_4_ == L'\0') {
        if (*size != 0) {
          uVar5 = (**(code **)((long)pvVar3 + 0x98))
                            (*(undefined8 *)((long)pvVar3 + 0x90),*buff,*size & 0xffffffff);
          *(undefined8 *)((long)pvVar3 + 0x90) = uVar5;
        }
        if (*(char *)((long)pvVar3 + 0xa2) != '\0') {
          if (*(long *)(*(long *)((long)pvVar3 + 0x70) + 0x28) != *(long *)((long)pvVar3 + 0x80)) {
            archive_set_error(&a->archive,-1,
                              "ZIP compressed data is wrong size (read %jd, expected %jd)",
                              *(undefined8 *)((long)pvVar3 + 0x80),
                              *(undefined8 *)(*(long *)((long)pvVar3 + 0x70) + 0x28));
            return L'\xffffffec';
          }
          if ((*(ulong *)(*(long *)((long)pvVar3 + 0x70) + 0x30) & 0xffffffff) !=
              (*(ulong *)((long)pvVar3 + 0x88) & 0xffffffff)) {
            archive_set_error(&a->archive,-1,
                              "ZIP uncompressed data is wrong size (read %jd, expected %jd)\n",
                              *(undefined8 *)((long)pvVar3 + 0x88),
                              *(undefined8 *)(*(long *)((long)pvVar3 + 0x70) + 0x30));
            return L'\xffffffec';
          }
          if ((((*(char *)((long)pvVar3 + 0x1ff0) == '\0') ||
               (*(int *)(*(long *)((long)pvVar3 + 0x70) + 0x84) != 2)) &&
              ((ulong)*(uint *)(*(long *)((long)pvVar3 + 0x70) + 0x78) !=
               *(ulong *)((long)pvVar3 + 0x90))) && (*(char *)((long)pvVar3 + 0xa0) == '\0')) {
            archive_set_error(&a->archive,-1,"ZIP bad CRC: 0x%lx should be 0x%lx",
                              *(undefined8 *)((long)pvVar3 + 0x90),
                              (ulong)*(uint *)(*(long *)((long)pvVar3 + 0x70) + 0x78));
            return L'\xffffffec';
          }
        }
        a_local._4_4_ = L'\0';
      }
      else {
        a_local._4_4_ = zip._4_4_;
      }
    }
    else {
      a_local._4_4_ = L'\x01';
    }
  }
  else {
    a_local._4_4_ = L'\x01';
  }
  return a_local._4_4_;
}

Assistant:

static int
archive_read_format_zip_read_data(struct archive_read *a,
    const void **buff, size_t *size, int64_t *offset)
{
	int r;
	struct zip *zip = (struct zip *)(a->format->data);

	if (zip->has_encrypted_entries ==
			ARCHIVE_READ_FORMAT_ENCRYPTION_DONT_KNOW) {
		zip->has_encrypted_entries = 0;
	}

	*offset = zip->entry_uncompressed_bytes_read;
	*size = 0;
	*buff = NULL;

	/* If we hit end-of-entry last time, return ARCHIVE_EOF. */
	if (zip->end_of_entry)
		return (ARCHIVE_EOF);

	/* Return EOF immediately if this is a non-regular file. */
	if (AE_IFREG != (zip->entry->mode & AE_IFMT))
		return (ARCHIVE_EOF);

	__archive_read_consume(a, zip->unconsumed);
	zip->unconsumed = 0;

	if (zip->init_decryption) {
		zip->has_encrypted_entries = 1;
		if (zip->entry->zip_flags & ZIP_STRONG_ENCRYPTED)
			r = read_decryption_header(a);
		else if (zip->entry->compression == WINZIP_AES_ENCRYPTION)
			r = init_WinZip_AES_decryption(a);
		else
			r = init_traditional_PKWARE_decryption(a);
		if (r != ARCHIVE_OK)
			return (r);
		zip->init_decryption = 0;
	}

	switch(zip->entry->compression) {
	case 0:  /* No compression. */
		r =  zip_read_data_none(a, buff, size, offset);
		break;
#ifdef HAVE_BZLIB_H
	case 12: /* ZIPx bzip2 compression. */
		r = zip_read_data_zipx_bzip2(a, buff, size, offset);
		break;
#endif
#if HAVE_LZMA_H && HAVE_LIBLZMA
	case 14: /* ZIPx LZMA compression. */
		r = zip_read_data_zipx_lzma_alone(a, buff, size, offset);
		break;
	case 95: /* ZIPx XZ compression. */
		r = zip_read_data_zipx_xz(a, buff, size, offset);
		break;
#endif
#if HAVE_ZSTD_H && HAVE_LIBZSTD
	case 93: /* ZIPx Zstd compression. */
		r = zip_read_data_zipx_zstd(a, buff, size, offset);
		break;
#endif
	/* PPMd support is built-in, so we don't need any #if guards. */
	case 98: /* ZIPx PPMd compression. */
		r = zip_read_data_zipx_ppmd(a, buff, size, offset);
		break;

#ifdef HAVE_ZLIB_H
	case 8: /* Deflate compression. */
		r =  zip_read_data_deflate(a, buff, size, offset);
		break;
#endif
	default: /* Unsupported compression. */
		/* Return a warning. */
		archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
		    "Unsupported ZIP compression method (%d: %s)",
		    zip->entry->compression, compression_name(zip->entry->compression));
		/* We can't decompress this entry, but we will
		 * be able to skip() it and try the next entry. */
		return (ARCHIVE_FAILED);
		break;
	}
	if (r != ARCHIVE_OK)
		return (r);
	/* Update checksum */
	if (*size)
		zip->entry_crc32 = zip->crc32func(zip->entry_crc32, *buff,
		    (unsigned)*size);
	/* If we hit the end, swallow any end-of-data marker. */
	if (zip->end_of_entry) {
		/* Check file size, CRC against these values. */
		if (zip->entry->compressed_size !=
		    zip->entry_compressed_bytes_read) {
			archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
			    "ZIP compressed data is wrong size "
			    "(read %jd, expected %jd)",
			    (intmax_t)zip->entry_compressed_bytes_read,
			    (intmax_t)zip->entry->compressed_size);
			return (ARCHIVE_WARN);
		}
		/* Size field only stores the lower 32 bits of the actual
		 * size. */
		if ((zip->entry->uncompressed_size & UINT32_MAX)
		    != (zip->entry_uncompressed_bytes_read & UINT32_MAX)) {
			archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
			    "ZIP uncompressed data is wrong size "
			    "(read %jd, expected %jd)\n",
			    (intmax_t)zip->entry_uncompressed_bytes_read,
			    (intmax_t)zip->entry->uncompressed_size);
			return (ARCHIVE_WARN);
		}
		/* Check computed CRC against header */
		if ((!zip->hctx_valid ||
		      zip->entry->aes_extra.vendor != AES_VENDOR_AE_2) &&
		   zip->entry->crc32 != zip->entry_crc32
		    && !zip->ignore_crc32) {
			archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
			    "ZIP bad CRC: 0x%lx should be 0x%lx",
			    (unsigned long)zip->entry_crc32,
			    (unsigned long)zip->entry->crc32);
			return (ARCHIVE_WARN);
		}
	}

	return (ARCHIVE_OK);
}